

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O1

ValidateXrHandleResult VerifyXrSpaceUserFBHandle(XrSpaceUserFB *handle_to_check)

{
  __node_base_ptr p_Var1;
  ValidateXrHandleResult VVar2;
  UniqueLock lock;
  unique_lock<std::mutex> local_28;
  
  VVar2 = VALIDATE_XR_HANDLE_INVALID;
  if (handle_to_check != (XrSpaceUserFB *)0x0) {
    if (*handle_to_check == (XrSpaceUserFB)0x0) {
      VVar2 = VALIDATE_XR_HANDLE_NULL;
    }
    else {
      local_28._M_device =
           &g_spaceuserfb_info.super_HandleInfoBase<XrSpaceUserFB_T_*,_GenValidUsageXrHandleInfo>.
            dispatch_mutex_;
      local_28._M_owns = false;
      std::unique_lock<std::mutex>::lock(&local_28);
      local_28._M_owns = true;
      p_Var1 = std::
               _Hashtable<XrSpaceUserFB_T_*,_std::pair<XrSpaceUserFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_std::allocator<std::pair<XrSpaceUserFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrSpaceUserFB_T_*>,_std::hash<XrSpaceUserFB_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::_M_find_before_node
                         ((_Hashtable<XrSpaceUserFB_T_*,_std::pair<XrSpaceUserFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_std::allocator<std::pair<XrSpaceUserFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrSpaceUserFB_T_*>,_std::hash<XrSpaceUserFB_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)&g_spaceuserfb_info,
                          (ulong)*handle_to_check %
                          g_spaceuserfb_info.
                          super_HandleInfoBase<XrSpaceUserFB_T_*,_GenValidUsageXrHandleInfo>.
                          info_map_._M_h._M_bucket_count,handle_to_check,
                          (__hash_code)*handle_to_check);
      if (p_Var1 == (__node_base_ptr)0x0) {
        VVar2 = VALIDATE_XR_HANDLE_INVALID;
      }
      else {
        VVar2 = VALIDATE_XR_HANDLE_SUCCESS - (p_Var1->_M_nxt == (_Hash_node_base *)0x0);
      }
      std::unique_lock<std::mutex>::~unique_lock(&local_28);
    }
  }
  return VVar2;
}

Assistant:

ValidateXrHandleResult VerifyXrSpaceUserFBHandle(const XrSpaceUserFB* handle_to_check) {
    return g_spaceuserfb_info.verifyHandle(handle_to_check);
}